

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fStencilTexturingTests.cpp
# Opt level: O0

bool deqp::gles31::Functional::anon_unknown_1::compareStencilToRed
               (TestLog *log,ConstPixelBufferAccess *stencilRef,ConstPixelBufferAccess *result)

{
  int iVar1;
  ConstPixelBufferAccess *pCVar2;
  int iVar3;
  int *piVar4;
  MessageBuilder *pMVar5;
  TestLog *this;
  char (*local_7e0) [8];
  ConstPixelBufferAccess local_750;
  allocator<char> local_721;
  string local_720;
  allocator<char> local_6f9;
  string local_6f8;
  LogImage local_6d8;
  allocator<char> local_641;
  string local_640;
  allocator<char> local_619;
  string local_618;
  LogImage local_5f8;
  allocator<char> local_561;
  string local_560;
  allocator<char> local_539;
  string local_538;
  LogImageSet local_518;
  MessageBuilder local_4d8;
  MessageBuilder local_358;
  MessageBuilder local_1c8;
  undefined1 local_48 [24];
  int res;
  int ref;
  int x;
  int y;
  int numFailed;
  int maxPrints;
  ConstPixelBufferAccess *result_local;
  ConstPixelBufferAccess *stencilRef_local;
  TestLog *log_local;
  
  y = 10;
  x = 0;
  _numFailed = result;
  result_local = stencilRef;
  stencilRef_local = (ConstPixelBufferAccess *)log;
  for (ref = 0; iVar1 = ref, iVar3 = tcu::ConstPixelBufferAccess::getHeight(result_local),
      iVar1 < iVar3; ref = ref + 1) {
    for (res = 0; iVar1 = res, iVar3 = tcu::ConstPixelBufferAccess::getWidth(result_local),
        iVar1 < iVar3; res = res + 1) {
      local_48._20_4_ = tcu::ConstPixelBufferAccess::getPixStencil(result_local,res,ref,0);
      tcu::ConstPixelBufferAccess::getPixelInt
                ((ConstPixelBufferAccess *)local_48,(int)_numFailed,res,ref);
      piVar4 = tcu::Vector<int,_4>::x((Vector<int,_4> *)local_48);
      local_48._16_4_ = *piVar4;
      if (local_48._20_4_ != local_48._16_4_) {
        if (x < 10) {
          tcu::TestLog::operator<<
                    (&local_1c8,(TestLog *)stencilRef_local,
                     (BeginMessageToken *)&tcu::TestLog::Message);
          pMVar5 = tcu::MessageBuilder::operator<<(&local_1c8,(char (*) [17])0xf0fa53);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(int *)(local_48 + 0x14));
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [7])0xf925e6);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(int *)(local_48 + 0x10));
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [6])0xf55827);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&res);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0xf95514);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&ref);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0xf2e642);
          tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_1c8);
        }
        else if (x == 10) {
          tcu::TestLog::operator<<
                    (&local_358,(TestLog *)stencilRef_local,
                     (BeginMessageToken *)&tcu::TestLog::Message);
          pMVar5 = tcu::MessageBuilder::operator<<(&local_358,(char (*) [4])0xf5a95f);
          tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_358);
        }
        x = x + 1;
      }
    }
  }
  tcu::TestLog::operator<<
            (&local_4d8,(TestLog *)stencilRef_local,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<(&local_4d8,(char (*) [7])0xf6c444);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&x);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [28])" faulty pixels, comparison ");
  if (x == 0) {
    local_7e0 = (char (*) [8])0xf22475;
  }
  else {
    local_7e0 = (char (*) [8])0xf328b8;
  }
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,local_7e0);
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_4d8);
  pCVar2 = stencilRef_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_538,"ComparisonResult",&local_539);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_560,"Image comparison result",&local_561);
  tcu::LogImageSet::LogImageSet(&local_518,&local_538,&local_560);
  this = tcu::TestLog::operator<<((TestLog *)pCVar2,&local_518);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_618,"Result",&local_619);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_640,"Result stencil buffer",&local_641);
  tcu::LogImage::LogImage
            (&local_5f8,&local_618,&local_640,_numFailed,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::TestLog::operator<<(this,&local_5f8);
  tcu::LogImage::~LogImage(&local_5f8);
  std::__cxx11::string::~string((string *)&local_640);
  std::allocator<char>::~allocator(&local_641);
  std::__cxx11::string::~string((string *)&local_618);
  std::allocator<char>::~allocator(&local_619);
  tcu::LogImageSet::~LogImageSet(&local_518);
  std::__cxx11::string::~string((string *)&local_560);
  std::allocator<char>::~allocator(&local_561);
  std::__cxx11::string::~string((string *)&local_538);
  std::allocator<char>::~allocator(&local_539);
  pCVar2 = stencilRef_local;
  if (0 < x) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_6f8,"Reference",&local_6f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_720,"Reference stencil buffer",&local_721);
    stencilToRedAccess(&local_750,result_local);
    tcu::LogImage::LogImage
              (&local_6d8,&local_6f8,&local_720,&local_750,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::TestLog::operator<<((TestLog *)pCVar2,&local_6d8);
    tcu::LogImage::~LogImage(&local_6d8);
    std::__cxx11::string::~string((string *)&local_720);
    std::allocator<char>::~allocator(&local_721);
    std::__cxx11::string::~string((string *)&local_6f8);
    std::allocator<char>::~allocator(&local_6f9);
  }
  tcu::TestLog::operator<<
            ((TestLog *)stencilRef_local,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
  return x == 0;
}

Assistant:

static bool compareStencilToRed (tcu::TestLog& log, const tcu::ConstPixelBufferAccess& stencilRef, const tcu::ConstPixelBufferAccess& result)
{
	const int		maxPrints		= 10;
	int				numFailed		= 0;

	DE_ASSERT(stencilRef.getFormat().order == TextureFormat::S);
	DE_ASSERT(stencilRef.getWidth() == result.getWidth() && stencilRef.getHeight() == result.getHeight());

	for (int y = 0; y < stencilRef.getHeight(); y++)
	{
		for (int x = 0; x < stencilRef.getWidth(); x++)
		{
			const int		ref		= stencilRef.getPixStencil(x, y);
			const int		res		= result.getPixelInt(x, y).x();

			if (ref != res)
			{
				if (numFailed < maxPrints)
					log << TestLog::Message << "ERROR: Expected " << ref << ", got " << res << " at (" << x << ", " << y << ")" << TestLog::EndMessage;
				else if (numFailed == maxPrints)
					log << TestLog::Message << "..." << TestLog::EndMessage;

				numFailed += 1;
			}
		}
	}

	log << TestLog::Message << "Found " << numFailed << " faulty pixels, comparison " << (numFailed == 0 ? "passed." : "FAILED!") << TestLog::EndMessage;

	log << TestLog::ImageSet("ComparisonResult", "Image comparison result")
		<< TestLog::Image("Result", "Result stencil buffer", result);

	if (numFailed > 0)
		log << TestLog::Image("Reference", "Reference stencil buffer", stencilToRedAccess(stencilRef));

	log << TestLog::EndImageSet;

	return numFailed == 0;
}